

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

int uv_thread_setpriority(uv_thread_t tid,int priority)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  pthread_t __thread2;
  long lVar4;
  int policy;
  sched_param param;
  
  if (priority - 3U < 0xfffffffb) {
    return -0x16;
  }
  iVar1 = pthread_getschedparam(tid,&policy,(sched_param *)&param);
  iVar2 = policy;
  if (iVar1 == 0) {
    if (policy == 0) {
      __thread2 = pthread_self();
      iVar1 = pthread_equal(tid,__thread2);
      if (iVar1 != 0) {
        lVar4 = syscall(0xba);
        iVar2 = setpriority(PRIO_PROCESS,(id_t)lVar4,priority * -2);
        if (iVar2 == 0) {
          return 0;
        }
        goto LAB_001b36d9;
      }
    }
    iVar2 = sched_get_priority_min(iVar2);
    iVar1 = sched_get_priority_max(policy);
    if (iVar1 != -1 && iVar2 != -1) {
      iVar2 = (*(code *)(&DAT_001db480 + *(int *)(&DAT_001db480 + (ulong)(priority + 2) * 4)))();
      return iVar2;
    }
  }
LAB_001b36d9:
  piVar3 = __errno_location();
  return -*piVar3;
}

Assistant:

int uv_thread_setpriority(uv_thread_t tid, int priority) {
  int r;
  int min;
  int max;
  int range;
  int prio;
  int policy;
  struct sched_param param;

  if (priority < UV_THREAD_PRIORITY_LOWEST || priority > UV_THREAD_PRIORITY_HIGHEST)
    return UV_EINVAL;

  r = pthread_getschedparam(tid, &policy, &param);
  if (r != 0)
    return UV__ERR(errno);

#ifdef __linux__
/**
 * for Linux, when schedule policy is SCHED_OTHER (default), priority must be 0,
 * we should set the nice value in this case.
*/
  if (SCHED_OTHER == policy && pthread_equal(tid, pthread_self()))
    return set_nice_for_calling_thread(priority);
#endif

#ifdef __PASE__
  min = 1;
  max = 127;
#else
  min = sched_get_priority_min(policy);
  max = sched_get_priority_max(policy);
#endif

  if (min == -1 || max == -1)
    return UV__ERR(errno);

  range = max - min;

  switch (priority) {
    case UV_THREAD_PRIORITY_HIGHEST:
      prio = max;
      break;
    case UV_THREAD_PRIORITY_ABOVE_NORMAL:
      prio = min + range * 3 / 4;
      break;
    case UV_THREAD_PRIORITY_NORMAL:
      prio = min + range / 2;
      break;
    case UV_THREAD_PRIORITY_BELOW_NORMAL:
      prio = min + range / 4;
      break;
    case UV_THREAD_PRIORITY_LOWEST:
      prio = min;
      break;
    default:
      return 0;
  }

  if (param.sched_priority != prio) {
    param.sched_priority = prio;
    r = pthread_setschedparam(tid, policy, &param);
    if (r != 0)
      return UV__ERR(errno);  
  }

  return 0;
}